

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O1

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
~DrawTestInstance(DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this)

{
  ~DrawTestInstance(this);
  operator_delete(this,0x1a8);
  return;
}

Assistant:

DrawTestInstance<T>::~DrawTestInstance (void)
{
}